

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GradeBook.cpp
# Opt level: O3

void __thiscall GradeBook::setCourseName(GradeBook *this,string *name)

{
  ostream *poVar1;
  long *local_38 [2];
  long local_28 [2];
  
  if ((name->_M_string_length < 0x1a) &&
     (std::__cxx11::string::_M_assign((string *)this), name->_M_string_length < 0x1a)) {
    return;
  }
  std::__cxx11::string::substr((ulong)local_38,(ulong)name);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\" exceeds maximum length (25).\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Limiting courseName to first 25 characters.\n",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void GradeBook::setCourseName(const std::string &name) {
    if (name.length() <= 25) { courseName = name; }

    if (name.length() > 25) {
        courseName = name.substr(0, 25);

        std::cout << "Name \"" << name << "\" exceeds maximum length (25).\n";
        std::cout << "Limiting courseName to first 25 characters.\n"
                  << std::endl;
    }
}